

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O2

HaF64 Determinant3x3(HaF64 (*matrix) [3],HaF64 *error)

{
  HaF64 HVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  HaF64 (*paHVar6) [3];
  HaI32 j;
  long lVar7;
  HaI32 k;
  long lVar8;
  int iVar9;
  HaI32 i;
  long lVar10;
  undefined1 auVar11 [16];
  HaF64 HVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaF64 parcialError;
  HaF64 cofactor [2] [2];
  undefined1 local_88 [16];
  HaF64 local_70;
  ulong local_68;
  ulong uStack_60;
  undefined1 *local_58;
  ulong uStack_50;
  HaF64 local_48 [4];
  
  local_68 = 0x8000000000000000;
  uStack_60 = 0x8000000000000000;
  local_58 = &DAT_bff0000000000000;
  uStack_50 = 0;
  auVar16 = ZEXT816(0) << 0x40;
  local_88._0_8_ = 0.0;
  local_88._8_8_ = 0;
  lVar10 = 0;
  while( true ) {
    if (lVar10 == 3) break;
    paHVar6 = matrix;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      iVar9 = 0;
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        if (lVar10 != lVar8) {
          local_48[lVar7 * 2 + (long)iVar9] = (*paHVar6)[lVar8];
          iVar9 = iVar9 + 1;
        }
      }
      paHVar6 = paHVar6 + 1;
    }
    HVar12 = Determinant2x2((HaF64 (*) [2])local_48,&local_70);
    HVar1 = matrix[2][lVar10];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = HVar1;
    auVar16._8_8_ = 0;
    lVar10 = lVar10 + 1;
    dVar3 = (double)local_58 * (double)HVar12;
    auVar15._0_8_ = (ulong)HVar1 ^ local_68;
    auVar15._8_8_ = uStack_60;
    local_58 = (undefined1 *)((ulong)local_58 ^ local_68);
    uStack_50 = uStack_50 ^ uStack_60;
    uVar4 = vcmpsd_avx512f(auVar15,auVar14,6);
    bVar5 = (bool)((byte)uVar4 & 1);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar3;
    auVar16 = vfmadd231sd_fma(auVar16,auVar14,auVar13);
    auVar11._0_8_ = bVar5 * auVar15._0_8_ + (ulong)!bVar5 * (long)HVar1;
    auVar11._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_70;
    auVar2 = vfmadd231sd_fma(local_88,auVar11,auVar2);
    local_88._0_8_ = auVar2._0_8_;
    local_88._8_8_ = auVar2._8_8_;
  }
  *error = (HaF64)local_88._0_8_;
  return auVar16._0_8_;
}

Assistant:

hacd::HaF64 Determinant3x3 (const hacd::HaF64 matrix[3][3], hacd::HaF64* const error)
{
	hacd::HaF64 sign = hacd::HaF64 (-1.0f);
	hacd::HaF64 det = hacd::HaF64 (0.0f);
	hacd::HaF64 accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 3; i ++)  {
		hacd::HaF64 cofactor[2][2];
		for (hacd::HaI32 j = 0; j < 2; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 3; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		hacd::HaF64 parcialError;
		hacd::HaF64 minorDet = Determinant2x2 (cofactor, &parcialError);
		accError += parcialError * Absolute (matrix[2][i]);
		det += sign * minorDet * matrix[2][i];
		sign *= hacd::HaF64 (-1.0f);
	}

	*error = accError;
	return det;
}